

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta_abstract.c
# Opt level: O0

TA_RetCode TA_SetOptInputParamInteger(TA_ParamHolder *param,uint paramIndex,TA_Integer value)

{
  int *piVar1;
  int *piVar2;
  TA_FuncInfo *funcInfo;
  TA_OptInputParameterInfo *paramInfo;
  TA_ParamHolderPriv *paramHolderPriv;
  TA_Integer value_local;
  uint paramIndex_local;
  TA_ParamHolder *param_local;
  TA_RetCode local_4;
  
  if (param == (TA_ParamHolder *)0x0) {
    local_4 = TA_BAD_PARAM;
  }
  else {
    piVar1 = (int *)param->hiddenData;
    if (*piVar1 == -0x5dfd4dfe) {
      if (*(long *)(piVar1 + 10) == 0) {
        local_4 = TA_INVALID_HANDLE;
      }
      else if (paramIndex < *(uint *)(*(long *)(piVar1 + 10) + 0x28)) {
        piVar2 = *(int **)(*(long *)(piVar1 + 4) + (ulong)paramIndex * 0x10 + 8);
        if (piVar2 == (int *)0x0) {
          local_4 = TA_INTERNAL_ERROR|TA_BAD_PARAM;
        }
        else if ((*piVar2 == 2) || (*piVar2 == 3)) {
          *(TA_Integer *)(*(long *)(piVar1 + 4) + (ulong)paramIndex * 0x10) = value;
          local_4 = TA_SUCCESS;
        }
        else {
          local_4 = TA_INVALID_PARAM_HOLDER_TYPE;
        }
      }
      else {
        local_4 = TA_BAD_PARAM;
      }
    }
    else {
      local_4 = TA_INVALID_PARAM_HOLDER;
    }
  }
  return local_4;
}

Assistant:

TA_RetCode TA_SetOptInputParamInteger( TA_ParamHolder *param,
                                       unsigned int paramIndex,
                                       TA_Integer value )
{

   TA_ParamHolderPriv *paramHolderPriv;
   const TA_OptInputParameterInfo *paramInfo;
   const TA_FuncInfo *funcInfo;

   if( param == NULL )
   {
      return TA_BAD_PARAM;
   }

   paramHolderPriv = (TA_ParamHolderPriv *)(param->hiddenData);
   if( paramHolderPriv->magicNumber != TA_PARAM_HOLDER_PRIV_MAGIC_NB )
   {
      return TA_INVALID_PARAM_HOLDER;
   }

   /* Make sure this index really exist. */
   funcInfo = paramHolderPriv->funcInfo;
   if( !funcInfo ) return TA_INVALID_HANDLE;
   if( paramIndex >= funcInfo->nbOptInput )
   {
      return TA_BAD_PARAM;
   }

   /* Verify the type of the parameter. */
   paramInfo = paramHolderPriv->optIn[paramIndex].optInputInfo;
   if( !paramInfo ) return TA_INTERNAL_ERROR(2);
   if( (paramInfo->type != TA_OptInput_IntegerRange) &&
       (paramInfo->type != TA_OptInput_IntegerList) )
   {
      return TA_INVALID_PARAM_HOLDER_TYPE;
   }

   /* keep a copy of the provided parameter. */
   paramHolderPriv->optIn[paramIndex].data.optInInteger = value;

   return TA_SUCCESS;
}